

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O0

char * gravity_object_debug(gravity_object_t *obj,_Bool is_free)

{
  uint32_t uVar1;
  char *local_60;
  gravity_class_t *local_58;
  char *local_50;
  char *name_3;
  gravity_class_t *c;
  char *name_2;
  char *name_1;
  char *name;
  _Bool is_free_local;
  gravity_object_t *obj_local;
  
  if ((obj == (gravity_object_t *)0x0) || (obj->isa == (gravity_class_t *)0x0)) {
    obj_local = (gravity_object_t *)0x1786db;
  }
  else if (obj->isa == gravity_class_int) {
    obj_local = (gravity_object_t *)anon_var_dwarf_1fca2;
  }
  else if (obj->isa == gravity_class_float) {
    obj_local = (gravity_object_t *)anon_var_dwarf_118b9;
  }
  else if (obj->isa == gravity_class_bool) {
    obj_local = (gravity_object_t *)anon_var_dwarf_1fcb8;
  }
  else if (obj->isa == gravity_class_null) {
    obj_local = (gravity_object_t *)anon_var_dwarf_118af;
  }
  else if (obj->isa == gravity_class_function) {
    name_1 = obj->identifier;
    if (name_1 == (char *)0x0) {
      name_1 = "ANONYMOUS";
    }
    snprintf(gravity_object_debug::buffer,0x200,"FUNCTION %p %s",obj,name_1);
    obj_local = (gravity_object_t *)gravity_object_debug::buffer;
  }
  else if (obj->isa == gravity_class_closure) {
    if (is_free) {
      local_50 = (char *)0x0;
    }
    else {
      local_50 = *(char **)(obj->identifier + 0x38);
    }
    name_2 = local_50;
    if (local_50 == (char *)0x0) {
      name_2 = "ANONYMOUS";
    }
    snprintf(gravity_object_debug::buffer,0x200,"CLOSURE %p %s",obj,name_2);
    obj_local = (gravity_object_t *)gravity_object_debug::buffer;
  }
  else if (obj->isa == gravity_class_class) {
    c = (gravity_class_t *)obj->identifier;
    if (c == (gravity_class_t *)0x0) {
      c = (gravity_class_t *)anon_var_dwarf_1fd74;
    }
    snprintf(gravity_object_debug::buffer,0x200,"CLASS %p %s",obj,c);
    obj_local = (gravity_object_t *)gravity_object_debug::buffer;
  }
  else if (obj->isa == gravity_class_string) {
    snprintf(gravity_object_debug::buffer,0x200,"STRING %p %s",obj,obj->objclass);
    obj_local = (gravity_object_t *)gravity_object_debug::buffer;
  }
  else if (obj->isa == gravity_class_instance) {
    if (is_free) {
      local_58 = (gravity_class_t *)0x0;
    }
    else {
      local_58 = obj->objclass;
    }
    if ((local_58 == (gravity_class_t *)0x0) || (local_58->identifier == (char *)0x0)) {
      local_60 = "ANONYMOUS";
    }
    else {
      local_60 = local_58->identifier;
    }
    snprintf(gravity_object_debug::buffer,0x200,"INSTANCE %p OF %s",obj,local_60);
    obj_local = (gravity_object_t *)gravity_object_debug::buffer;
  }
  else if (obj->isa == gravity_class_range) {
    snprintf(gravity_object_debug::buffer,0x200,"RANGE %p %ld %ld",obj,obj->objclass,obj->identifier
            );
    obj_local = (gravity_object_t *)gravity_object_debug::buffer;
  }
  else if (obj->isa == gravity_class_list) {
    snprintf(gravity_object_debug::buffer,0x200,"LIST %p (%ld items)",obj,obj->objclass);
    obj_local = (gravity_object_t *)gravity_object_debug::buffer;
  }
  else if (obj->isa == gravity_class_map) {
    uVar1 = gravity_hash_count((gravity_hash_t *)obj->objclass);
    snprintf(gravity_object_debug::buffer,0x200,"MAP %p (%ld items)",obj,(ulong)uVar1);
    obj_local = (gravity_object_t *)gravity_object_debug::buffer;
  }
  else if (obj->isa == gravity_class_fiber) {
    snprintf(gravity_object_debug::buffer,0x200,"FIBER %p",obj);
    obj_local = (gravity_object_t *)gravity_object_debug::buffer;
  }
  else if (obj->isa == gravity_class_upvalue) {
    snprintf(gravity_object_debug::buffer,0x200,"UPVALUE %p",obj);
    obj_local = (gravity_object_t *)gravity_object_debug::buffer;
  }
  else {
    obj_local = (gravity_object_t *)anon_var_dwarf_118ed;
  }
  return (char *)obj_local;
}

Assistant:

const char *gravity_object_debug (gravity_object_t *obj, bool is_free) {
    if ((!obj) || (!OBJECT_IS_VALID(obj))) return "";

    if (OBJECT_ISA_INT(obj)) return "INT";
    if (OBJECT_ISA_FLOAT(obj)) return "FLOAT";
    if (OBJECT_ISA_BOOL(obj)) return "BOOL";
    if (OBJECT_ISA_NULL(obj)) return "NULL";

    static char buffer[512];
    if (OBJECT_ISA_FUNCTION(obj)) {
        const char *name = ((gravity_function_t*)obj)->identifier;
        if (!name) name = "ANONYMOUS";
        snprintf(buffer, sizeof(buffer), "FUNCTION %p %s", obj, name);
        return buffer;
    }

    if (OBJECT_ISA_CLOSURE(obj)) {
        // cannot guarantee ptr validity during a free
        const char *name = (is_free) ? NULL : ((gravity_closure_t*)obj)->f->identifier;
        if (!name) name = "ANONYMOUS";
        snprintf(buffer, sizeof(buffer), "CLOSURE %p %s", obj, name);
        return buffer;
    }

    if (OBJECT_ISA_CLASS(obj)) {
        const char *name = ((gravity_class_t*)obj)->identifier;
        if (!name) name = "ANONYMOUS";
        snprintf(buffer, sizeof(buffer), "CLASS %p %s", obj, name);
        return buffer;
    }

    if (OBJECT_ISA_STRING(obj)) {
        snprintf(buffer, sizeof(buffer), "STRING %p %s", obj, ((gravity_string_t*)obj)->s);
        return buffer;
    }

    if (OBJECT_ISA_INSTANCE(obj)) {
        // cannot guarantee ptr validity during a free
        gravity_class_t *c = (is_free) ? NULL : ((gravity_instance_t*)obj)->objclass;
        const char *name = (c && c->identifier) ? c->identifier : "ANONYMOUS";
        snprintf(buffer, sizeof(buffer), "INSTANCE %p OF %s", obj, name);
        return buffer;
    }

    if (OBJECT_ISA_RANGE(obj)) {
        snprintf(buffer, sizeof(buffer), "RANGE %p %ld %ld", obj, (long)((gravity_range_t*)obj)->from, (long)((gravity_range_t*)obj)->to);
        return buffer;
    }

    if (OBJECT_ISA_LIST(obj)) {
        snprintf(buffer, sizeof(buffer), "LIST %p (%ld items)", obj, (long)marray_size(((gravity_list_t*)obj)->array));
        return buffer;
    }

    if (OBJECT_ISA_MAP(obj)) {
         snprintf(buffer, sizeof(buffer), "MAP %p (%ld items)", obj, (long)gravity_hash_count(((gravity_map_t*)obj)->hash));
         return buffer;
    }

    if (OBJECT_ISA_FIBER(obj)) {
        snprintf(buffer, sizeof(buffer), "FIBER %p", obj);
        return buffer;
    }

    if (OBJECT_ISA_UPVALUE(obj)) {
        snprintf(buffer, sizeof(buffer), "UPVALUE %p", obj);
        return buffer;
    }

    return "N/A";
}